

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonDocument.cpp
# Opt level: O0

JsonObject * __thiscall json::JsonDocument::setObjectAsRoot(JsonDocument *this)

{
  JsonObject *pJVar1;
  type this_00;
  unique_ptr<json::JsonObject,_std::default_delete<json::JsonObject>_> local_18;
  JsonDocument *local_10;
  JsonDocument *this_local;
  
  local_10 = this;
  pJVar1 = (JsonObject *)operator_new(0x50);
  JsonObject::JsonObject(pJVar1);
  std::unique_ptr<json::JsonObject,std::default_delete<json::JsonObject>>::
  unique_ptr<std::default_delete<json::JsonObject>,void>
            ((unique_ptr<json::JsonObject,std::default_delete<json::JsonObject>> *)&local_18,pJVar1)
  ;
  std::unique_ptr<json::JsonNode,std::default_delete<json::JsonNode>>::operator=
            ((unique_ptr<json::JsonNode,std::default_delete<json::JsonNode>> *)this,&local_18);
  std::unique_ptr<json::JsonObject,_std::default_delete<json::JsonObject>_>::~unique_ptr(&local_18);
  this_00 = std::unique_ptr<json::JsonNode,_std::default_delete<json::JsonNode>_>::operator*
                      (&this->root);
  pJVar1 = JsonNode::operator_cast_to_JsonObject_(this_00);
  return pJVar1;
}

Assistant:

JsonObject &JsonDocument::setObjectAsRoot()
    {
        root = std::unique_ptr<JsonObject>(new JsonObject());
        return *root;
    }